

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O0

int OpenRS232Port(RS232PORT *pRS232Port,char *szDevPath)

{
  int iVar1;
  size_t sVar2;
  int iResult;
  char *szDevPath_local;
  RS232PORT *pRS232Port_local;
  
  memset(pRS232Port->szDevPath,0,0x100);
  memset(pRS232Port->address,0,0x100);
  memset(pRS232Port->port,0,0x100);
  pRS232Port->DevType = -1;
  iVar1 = GetAddrPortTypeFromDevPath
                    (szDevPath,pRS232Port->address,0x100,pRS232Port->port,0x100,&pRS232Port->DevType
                    );
  if (iVar1 == 0) {
    switch(pRS232Port->DevType) {
    case 0:
      iVar1 = OpenComputerRS232Port(&pRS232Port->hDev,szDevPath);
      if (iVar1 != 0) {
        return 1;
      }
      PurgeComputerRS232Port(pRS232Port->hDev);
      break;
    case 1:
      iVar1 = inittcpcli(&pRS232Port->s,pRS232Port->address,pRS232Port->port);
      if (iVar1 != 0) {
        return 1;
      }
      break;
    case 2:
      sVar2 = strlen(pRS232Port->address);
      if (sVar2 == 0) {
        iVar1 = inittcpsrv(&pRS232Port->s_srv,"0.0.0.0",pRS232Port->port,1,10000);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        iVar1 = inittcpsrv(&pRS232Port->s_srv,pRS232Port->address,pRS232Port->port,1,10000);
        if (iVar1 != 0) {
          return 1;
        }
      }
      iVar1 = waitforclifortcpsrv(pRS232Port->s_srv,&pRS232Port->s,10000);
      if (iVar1 != 0) {
        releasetcpsrv(pRS232Port->s_srv);
        return 1;
      }
      break;
    case 3:
      iVar1 = initudpcli(&pRS232Port->s,pRS232Port->address,pRS232Port->port);
      if (iVar1 != 0) {
        return 1;
      }
      break;
    case 4:
      sVar2 = strlen(pRS232Port->address);
      if (sVar2 == 0) {
        iVar1 = initudpsrv(&pRS232Port->s_srv,"0.0.0.0",pRS232Port->port,10000);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        iVar1 = initudpsrv(&pRS232Port->s_srv,pRS232Port->address,pRS232Port->port,10000);
        if (iVar1 != 0) {
          return 1;
        }
      }
      iVar1 = waitforcliforudpsrv(pRS232Port->s_srv,&pRS232Port->s,10000);
      if (iVar1 != 0) {
        releasetcpsrv(pRS232Port->s_srv);
        return 1;
      }
      break;
    default:
      return 1;
    }
    sprintf(pRS232Port->szDevPath,"%.255s",szDevPath);
    pRS232Port_local._4_4_ = 0;
  }
  else {
    pRS232Port_local._4_4_ = 3;
  }
  return pRS232Port_local._4_4_;
}

Assistant:

inline int OpenRS232Port(RS232PORT* pRS232Port, char* szDevPath)
{
	int iResult = EXIT_FAILURE;

	memset(pRS232Port->szDevPath, 0, sizeof(pRS232Port->szDevPath));
	memset(pRS232Port->address, 0, sizeof(pRS232Port->address));
	memset(pRS232Port->port, 0, sizeof(pRS232Port->port));
	pRS232Port->DevType = -1;

	// Try to determine whether it is a server TCP port (e.g. :4001), client IP address and TCP port (e.g. 127.0.0.1:4001), 
	// server UDP port (udp:4001), client IP address and UDP port (e.g. udp://127.0.0.1:4001) or local RS232 port.
	if (GetAddrPortTypeFromDevPath(szDevPath, pRS232Port->address, sizeof(pRS232Port->address), pRS232Port->port, sizeof(pRS232Port->port), &pRS232Port->DevType) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_RS232PORT(("OpenRS232Port error (%s) : %s"
			"(szDevPath=%s)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_PARAMETER],
			szDevPath));
		return EXIT_INVALID_PARAMETER;
	}

	switch (pRS232Port->DevType)
	{
	case TCP_CLIENT_TYPE_RS232PORT:
		if (inittcpcli(&pRS232Port->s, pRS232Port->address, pRS232Port->port) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_ERROR_RS232PORT(("OpenRS232Port error (%s) : %s"
				"(szDevPath=%s)\n",
				strtime_m(),
				"inittcpcli failed. ",
				szDevPath));
			return EXIT_FAILURE;
		}
		break;
	case TCP_SERVER_TYPE_RS232PORT:
		if (strlen(pRS232Port->address) == 0)
		{
			if (inittcpsrv(&pRS232Port->s_srv, "0.0.0.0", pRS232Port->port, 1, DEFAULT_SOCK_TIMEOUT) != EXIT_SUCCESS)
			{
				PRINT_DEBUG_ERROR_RS232PORT(("OpenRS232Port error (%s) : %s"
					"(szDevPath=%s)\n",
					strtime_m(),
					"inittcpsrv failed. ",
					szDevPath));
				return EXIT_FAILURE;
			}
		}
		else
		{
			if (inittcpsrv(&pRS232Port->s_srv, pRS232Port->address, pRS232Port->port, 1, DEFAULT_SOCK_TIMEOUT) != EXIT_SUCCESS)
			{
				PRINT_DEBUG_ERROR_RS232PORT(("OpenRS232Port error (%s) : %s"
					"(szDevPath=%s)\n",
					strtime_m(),
					"inittcpsrv failed. ",
					szDevPath));
				return EXIT_FAILURE;
			}
		}
		iResult = waitforclifortcpsrv(pRS232Port->s_srv, &pRS232Port->s, DEFAULT_SOCK_TIMEOUT);
		switch (iResult)
		{
		case EXIT_SUCCESS:
			break;
		case EXIT_TIMEOUT:
		default:
			PRINT_DEBUG_ERROR_RS232PORT(("OpenRS232Port error (%s) : %s"
				"(szDevPath=%s)\n",
				strtime_m(),
				"waitforclifortcpsrv failed or timed out. ",
				szDevPath));
			releasetcpsrv(pRS232Port->s_srv);
			return EXIT_FAILURE;
		}
		break;
	case UDP_CLIENT_TYPE_RS232PORT:
		if (initudpcli(&pRS232Port->s, pRS232Port->address, pRS232Port->port) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_ERROR_RS232PORT(("OpenRS232Port error (%s) : %s"
				"(szDevPath=%s)\n",
				strtime_m(),
				"initudpcli failed. ",
				szDevPath));
			return EXIT_FAILURE;
		}
		break;
	case UDP_SERVER_TYPE_RS232PORT:
		if (strlen(pRS232Port->address) == 0)
		{
			if (initudpsrv(&pRS232Port->s_srv, "0.0.0.0", pRS232Port->port, DEFAULT_SOCK_TIMEOUT) != EXIT_SUCCESS)
			{
				PRINT_DEBUG_ERROR_RS232PORT(("OpenRS232Port error (%s) : %s"
					"(szDevPath=%s)\n",
					strtime_m(),
					"initudpsrv failed. ",
					szDevPath));
				return EXIT_FAILURE;
			}
		}
		else
		{
			if (initudpsrv(&pRS232Port->s_srv, pRS232Port->address, pRS232Port->port, DEFAULT_SOCK_TIMEOUT) != EXIT_SUCCESS)
			{
				PRINT_DEBUG_ERROR_RS232PORT(("OpenRS232Port error (%s) : %s"
					"(szDevPath=%s)\n",
					strtime_m(),
					"initudpsrv failed. ",
					szDevPath));
				return EXIT_FAILURE;
			}
		}
		iResult = waitforcliforudpsrv(pRS232Port->s_srv, &pRS232Port->s, DEFAULT_SOCK_TIMEOUT);
		switch (iResult)
		{
		case EXIT_SUCCESS:
			break;
		case EXIT_TIMEOUT:
		default:
			PRINT_DEBUG_ERROR_RS232PORT(("OpenRS232Port error (%s) : %s"
				"(szDevPath=%s)\n",
				strtime_m(),
				"waitforcliforudpsrv failed or timed out. ",
				szDevPath));
			releasetcpsrv(pRS232Port->s_srv);
			return EXIT_FAILURE;
		}
		break;
	case LOCAL_TYPE_RS232PORT:
		if (OpenComputerRS232Port(&pRS232Port->hDev, szDevPath) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_ERROR_RS232PORT(("OpenRS232Port error (%s) : %s"
				"(szDevPath=%s)\n",
				strtime_m(),
				"OpenComputerRS232Port failed. ",
				szDevPath));
			return EXIT_FAILURE;
		}
		if (PurgeComputerRS232Port(pRS232Port->hDev) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_WARNING_RS232PORT(("OpenRS232Port warning (%s) : %s"
				"(szDevPath=%s)\n",
				strtime_m(),
				"PurgeComputerRS232Port failed. ",
				szDevPath));
		}
		break;
	default:
		PRINT_DEBUG_ERROR_RS232PORT(("OpenRS232Port error (%s) : %s"
			"(szDevPath=%s)\n",
			strtime_m(),
			"Invalid device type. ",
			szDevPath));
		return EXIT_FAILURE;
	}

	sprintf(pRS232Port->szDevPath, "%.255s", szDevPath);

	return EXIT_SUCCESS;
}